

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O0

void capnp::_::expectPrimitiveEq<capnp::Data::Reader>(Reader a,Reader b)

{
  bool bVar1;
  bool local_59;
  DebugExpression<capnp::Data::Reader_&> DStack_58;
  bool _kj_shouldLog;
  undefined1 local_50 [8];
  DebugComparison<capnp::Data::Reader_&,_capnp::Data::Reader_&> _kjCondition;
  Reader b_local;
  Reader a_local;
  
  b_local.super_ArrayPtr<const_unsigned_char>.ptr =
       (uchar *)b.super_ArrayPtr<const_unsigned_char>.size_;
  _kjCondition._32_8_ = b.super_ArrayPtr<const_unsigned_char>.ptr;
  b_local.super_ArrayPtr<const_unsigned_char>.size_ =
       (size_t)a.super_ArrayPtr<const_unsigned_char>.ptr;
  DStack_58 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (Reader *)&b_local.super_ArrayPtr<const_unsigned_char>.size_);
  kj::_::DebugExpression<capnp::Data::Reader&>::operator==
            ((DebugComparison<capnp::Data::Reader_&,_capnp::Data::Reader_&> *)local_50,
             (DebugExpression<capnp::Data::Reader&> *)&stack0xffffffffffffffa8,
             (Reader *)&_kjCondition.result);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar1) {
    local_59 = kj::_::Debug::shouldLog(ERROR);
    while (local_59 != false) {
      kj::_::Debug::
      log<char_const(&)[28],kj::_::DebugComparison<capnp::Data::Reader&,capnp::Data::Reader&>&,capnp::Data::Reader&,capnp::Data::Reader&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
                 ,0x9c,ERROR,"\"failed: expected \" \"(a) == (b)\", _kjCondition, a, b",
                 (char (*) [28])"failed: expected (a) == (b)",
                 (DebugComparison<capnp::Data::Reader_&,_capnp::Data::Reader_&> *)local_50,
                 (Reader *)&b_local.super_ArrayPtr<const_unsigned_char>.size_,
                 (Reader *)&_kjCondition.result);
      local_59 = false;
    }
  }
  return;
}

Assistant:

inline void expectPrimitiveEq(float a, float b) { EXPECT_FLOAT_EQ(a, b); }